

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::CompressionParameters> *
kj::_::tryParseExtensionOffers
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers)

{
  bool bVar1;
  ArrayPtr<const_char> *pAVar2;
  int iVar3;
  char in_R8B;
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  NullableValue<kj::CompressionParameters> _config5141;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  Vector<kj::ArrayPtr<const_char>_> splitOffers;
  NullableValue<kj::CompressionParameters> local_60;
  
  input.ptr = (char *)(offers.content.size_ - 1);
  input.size_ = 0x2c;
  splitParts(&splitOffers,(_ *)offers.content.ptr,input,in_R8B);
  for (pAVar2 = splitOffers.builder.ptr; pAVar2 != splitOffers.builder.pos; pAVar2 = pAVar2 + 1) {
    input_00.size_ = 0x3b;
    input_00.ptr = (char *)pAVar2->size_;
    splitParts((Vector<kj::ArrayPtr<const_char>_> *)&splitOffer.builder,(_ *)pAVar2->ptr,input_00,
               in_R8B);
    _config5141._0_8_ = anon_var_dwarf_a30c7e;
    _config5141.field_1._0_8_ = 0x12;
    bVar1 = ArrayPtr<const_char>::operator==
                      (splitOffer.builder.ptr,(ArrayPtr<const_char> *)&_config5141);
    iVar3 = 3;
    if (bVar1) {
      tryExtractParameters
                ((Maybe<kj::CompressionParameters> *)&local_60,
                 (Vector<kj::ArrayPtr<const_char>_> *)&splitOffer.builder,false);
      NullableValue<kj::CompressionParameters>::NullableValue(&_config5141,&local_60);
      iVar3 = 0;
      if (_config5141.isSet == true) {
        NullableValue<kj::CompressionParameters>::NullableValue
                  (&__return_storage_ptr__->ptr,&_config5141.field_1.value);
        iVar3 = 1;
      }
    }
    ArrayBuilder<kj::ArrayPtr<const_char>_>::dispose(&splitOffer.builder);
    if ((iVar3 != 3) && (iVar3 != 0)) goto LAB_00364593;
  }
  (__return_storage_ptr__->ptr).isSet = false;
LAB_00364593:
  ArrayBuilder<kj::ArrayPtr<const_char>_>::dispose(&splitOffers.builder);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> tryParseExtensionOffers(StringPtr offers) {
  // Given a string of offers, accept the first valid offer by returning a `CompressionParameters`
  // struct. If there are no valid offers, return `kj::none`.
  auto splitOffers = splitParts(offers, ',');

  for (const auto& offer : splitOffers) {
    auto splitOffer = splitParts(offer, ';');

    if (splitOffer.front() != "permessage-deflate"_kj) {
      // Extension token was invalid.
      continue;
    }
    KJ_IF_SOME(config, tryExtractParameters(splitOffer, false)) {
      return kj::mv(config);
    }
  }
  return kj::none;
}